

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_step(sqlite3_stmt *pStmt)

{
  int *piVar1;
  ushort uVar2;
  sqlite3 *db;
  sqlite3 *psVar3;
  sqlite3 *psVar4;
  Btree *p_00;
  Wal *pWVar5;
  Vdbe *pVVar6;
  uint *puVar7;
  undefined8 *puVar8;
  bool bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  long *plVar12;
  Vdbe *p_01;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  sqlite3_stmt *psVar17;
  ulong uVar18;
  char *pcVar19;
  size_t sVar20;
  ulong uVar21;
  byte bVar22;
  undefined8 uVar23;
  char *pcVar24;
  Vdbe *p;
  long *plVar25;
  long lVar26;
  int iVar27;
  int n;
  byte *pbVar28;
  Mem *pMem;
  u32 uVar29;
  char *pcVar30;
  long lVar31;
  int iVar32;
  uint uVar33;
  ulong uVar34;
  undefined4 uVar35;
  Mem *local_1c8;
  Vdbe *local_160;
  StrAccum local_158 [9];
  
  iVar13 = vdbeSafetyNotNull((Vdbe *)pStmt);
  if (iVar13 == 0) {
    db = *(sqlite3 **)pStmt;
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    pStmt[0xc5] = (sqlite3_stmt)((byte)pStmt[0xc5] & 0xef);
    iVar13 = 0;
    do {
      if (*(int *)(pStmt + 0x24) != 0x2df20da3) {
        sqlite3_reset(pStmt);
      }
      psVar3 = *(sqlite3 **)pStmt;
      if (psVar3->mallocFailed != '\0') {
        *(undefined4 *)(pStmt + 0x38) = 7;
        uVar33 = 7;
        goto LAB_00123242;
      }
      if (*(int *)(pStmt + 0x34) < 0) {
        if (((byte)pStmt[0xc5] & 3) == 0) {
          if (*(int *)(pStmt + 0x34) < 0) {
            if (psVar3->nVdbeActive == 0) {
              (psVar3->u1).isInterrupted = 0;
            }
            if ((((psVar3->mTrace & 0x82) != 0) && ((psVar3->init).busy == '\0')) &&
               (*(long *)(pStmt + 0xf0) != 0)) {
              sqlite3OsCurrentTimeInt64(psVar3->pVfs,(sqlite3_int64 *)(pStmt + 0xb8));
            }
            psVar3->nVdbeActive = psVar3->nVdbeActive + 1;
            if (((byte)pStmt[0xc6] & 1) == 0) {
              psVar3->nVdbeWrite = psVar3->nVdbeWrite + 1;
            }
            if (((byte)pStmt[0xc6] & 2) != 0) {
              psVar3->nVdbeRead = psVar3->nVdbeRead + 1;
            }
            *(undefined4 *)(pStmt + 0x34) = 0;
          }
          goto LAB_00122d7e;
        }
        *(undefined4 *)(pStmt + 0x38) = 0x11;
        uVar33 = 1;
        goto LAB_00123221;
      }
LAB_00122d7e:
      if ((*(ushort *)(pStmt + 0xc5) & 0xc) == 0) {
        psVar3->nVdbeExec = psVar3->nVdbeExec + 1;
        uVar16 = sqlite3VdbeExec((Vdbe *)pStmt);
        psVar3->nVdbeExec = psVar3->nVdbeExec + -1;
        goto LAB_0012309a;
      }
      psVar4 = *(sqlite3 **)pStmt;
      bVar22 = 1;
      if ((*(ushort *)(pStmt + 0xc5) & 0xc) != 4) {
        bVar22 = *(byte *)((long)&psVar4->flags + 3) & 1;
      }
      lVar26 = *(long *)(pStmt + 0x68);
      local_1c8 = (Mem *)(lVar26 + 0x38);
      releaseMemArray(local_1c8,8);
      *(undefined8 *)(pStmt + 0xa0) = 0;
      if (*(int *)(pStmt + 0x38) == 7) {
        sqlite3OomFault(psVar4);
LAB_00122dd5:
        uVar16 = 1;
        goto LAB_0012309a;
      }
      iVar15 = *(int *)(pStmt + 0x90);
      if (bVar22 == 0) {
        pMem = (Mem *)0x0;
        plVar25 = (long *)0x0;
        uVar34 = 0;
      }
      else {
        lVar31 = *(long *)(pStmt + 0x68);
        if ((*(byte *)(lVar31 + 0x200) & 0x10) == 0) {
          plVar25 = (long *)0x0;
          uVar34 = 0;
        }
        else {
          uVar34 = (ulong)(uint)(*(int *)(lVar31 + 0x204) >> 3);
          plVar25 = *(long **)(lVar31 + 0x208);
        }
        pMem = (Mem *)(lVar31 + 0x1f8);
        if (0 < (int)uVar34) {
          uVar21 = 0;
          do {
            iVar15 = iVar15 + *(int *)(plVar25[uVar21] + 8);
            uVar21 = uVar21 + 1;
          } while (uVar34 != uVar21);
        }
      }
      iVar32 = *(int *)(pStmt + 0x34);
      *(int *)(pStmt + 0x34) = iVar32 + 1;
      if (iVar32 < iVar15) {
        uVar16 = 0;
        do {
          iVar27 = iVar32 - *(int *)(pStmt + 0x90);
          psVar17 = pStmt + 0x88;
          if (*(int *)(pStmt + 0x90) <= iVar32) {
            psVar17 = (sqlite3_stmt *)*plVar25;
            iVar14 = *(int *)(psVar17 + 8);
            iVar32 = iVar27;
            plVar12 = plVar25;
            if (iVar14 <= iVar27) {
              do {
                iVar27 = iVar27 - iVar14;
                psVar17 = (sqlite3_stmt *)plVar12[1];
                iVar14 = *(int *)(psVar17 + 8);
                iVar32 = iVar27;
                plVar12 = plVar12 + 1;
              } while (iVar14 <= iVar27);
            }
          }
          pbVar28 = (byte *)((long)iVar32 * 0x18 + *(long *)psVar17);
          if ((bVar22 != 0) && (pbVar28[1] == 0xfc)) {
            iVar27 = (int)uVar34;
            if (iVar27 < 1) {
              uVar21 = 0;
            }
            else {
              uVar18 = 0;
              do {
                uVar21 = uVar18;
                if (plVar25[uVar18] == *(long *)(pbVar28 + 0x10)) break;
                uVar18 = uVar18 + 1;
                uVar21 = uVar34;
              } while (uVar34 != uVar18);
            }
            bVar9 = true;
            if ((int)uVar21 == iVar27) {
              n = iVar27 * 8 + 8;
              iVar14 = sqlite3VdbeMemGrow(pMem,n,(uint)(iVar27 != 0));
              *(int *)(pStmt + 0x38) = iVar14;
              if (iVar14 == 0) {
                plVar25 = (long *)pMem->z;
                uVar34 = (ulong)(iVar27 + 1);
                plVar25[iVar27] = *(long *)(pbVar28 + 0x10);
                *(byte *)&pMem->flags = (byte)pMem->flags | 0x10;
                pMem->n = n;
                iVar15 = iVar15 + *(int *)(*(long *)(pbVar28 + 0x10) + 8);
              }
              else {
                uVar16 = 1;
                bVar9 = false;
              }
            }
            if (!bVar9) goto LAB_0012308c;
          }
          if (((byte)pStmt[0xc5] & 8) == 0) goto LAB_0012308c;
          if (*pbVar28 == 0x3d) {
            if (1 < *(int *)(pStmt + 0x34)) goto LAB_0012308c;
          }
          else if (*pbVar28 == 0xab) goto LAB_0012308c;
          iVar32 = *(int *)(pStmt + 0x34);
          *(int *)(pStmt + 0x34) = iVar32 + 1;
        } while (iVar32 < iVar15);
      }
      else {
        pbVar28 = (byte *)0x0;
      }
      *(undefined4 *)(pStmt + 0x38) = 0;
      uVar16 = 0x65;
LAB_0012308c:
      if (uVar16 != 0) goto LAB_0012309a;
      if ((psVar4->u1).isInterrupted != 0) {
        *(undefined4 *)(pStmt + 0x38) = 9;
        sqlite3VdbeError((Vdbe *)pStmt,"interrupted");
        goto LAB_00122dd5;
      }
      if ((*(ushort *)(pStmt + 0xc5) & 0xc) == 4) {
        *(undefined2 *)(lVar26 + 0x40) = 4;
        *(long *)(lVar26 + 0x38) = (long)iVar32;
        *(undefined2 *)(lVar26 + 0x78) = 0xa02;
        pcVar19 = *(char **)(sqlite3OpcodeName_azName + (ulong)*pbVar28 * 8);
        *(char **)(lVar26 + 0x80) = pcVar19;
        sVar20 = strlen(pcVar19);
        *(uint *)(lVar26 + 0x7c) = (uint)sVar20 & 0x3fffffff;
        *(undefined1 *)(lVar26 + 0x7a) = 1;
        local_1c8 = (Mem *)(lVar26 + 0xa8);
      }
      local_1c8->flags = 4;
      local_1c8->u = (MemValue)(long)*(int *)(pbVar28 + 4);
      local_1c8[1].flags = 4;
      local_1c8[1].u = (MemValue)(long)*(int *)(pbVar28 + 8);
      local_1c8[2].flags = 4;
      local_1c8[2].u = (MemValue)(long)*(int *)(pbVar28 + 0xc);
      if (local_1c8[3].szMalloc < 100) {
        iVar15 = sqlite3VdbeMemGrow(local_1c8 + 3,100,0);
        uVar16 = 1;
        if (iVar15 != 0) goto LAB_0012309a;
      }
      else {
        local_1c8[3].z = local_1c8[3].zMalloc;
        local_1c8[3].flags = local_1c8[3].flags & 0xd;
      }
      local_1c8[3].flags = 0x202;
      pcVar19 = local_1c8[3].z;
      local_158[0].nAlloc = local_1c8[3].szMalloc;
      local_158[0].db = (sqlite3 *)0x0;
      local_158[0].mxAlloc = 0;
      local_158[0].nChar = 0;
      local_158[0].accError = '\0';
      local_158[0].printfFlags = '\0';
      pcVar30 = pcVar19;
      local_158[0].zText = pcVar19;
      switch(pbVar28[1]) {
      case 0xef:
      case 0xfb:
        *pcVar19 = '\0';
        break;
      default:
        pcVar30 = *(char **)(pbVar28 + 0x10);
        if (*(char **)(pbVar28 + 0x10) == (char *)0x0) {
          *pcVar19 = '\0';
          pcVar30 = pcVar19;
        }
        break;
      case 0xf1:
        puVar7 = *(uint **)(pbVar28 + 0x10);
        uVar33 = *puVar7;
        if (0 < (int)uVar33) {
          lVar26 = 1;
          do {
            sqlite3_str_appendf(local_158,",%d",(ulong)puVar7[lVar26]);
            lVar26 = lVar26 + 1;
          } while ((ulong)uVar33 + 1 != lVar26);
        }
        *pcVar19 = '[';
        uVar34 = (ulong)local_158[0].nChar;
        if (local_158[0].nChar + 1 < local_158[0].nAlloc) {
          local_158[0].nChar = local_158[0].nChar + 1;
          local_158[0].zText[uVar34] = ']';
        }
        else {
          enlargeAndAppend(local_158,"]",1);
        }
        break;
      case 0xf2:
        uVar23 = **(undefined8 **)(pbVar28 + 0x10);
LAB_00123661:
        pcVar19 = "%lld";
        goto LAB_0012385b;
      case 0xf3:
        uVar35 = (undefined4)**(undefined8 **)(pbVar28 + 0x10);
LAB_001235de:
        sqlite3_str_appendf(local_158,"%.16g",uVar35);
        break;
      case 0xf4:
        uVar23 = *(undefined8 *)(*(long *)(pbVar28 + 0x10) + 0x10);
        pcVar19 = "vtab:%p";
        goto LAB_0012385b;
      case 0xf5:
        puVar8 = *(undefined8 **)(pbVar28 + 0x10);
        uVar2 = *(ushort *)(puVar8 + 1);
        if ((uVar2 & 2) == 0) {
          if ((uVar2 & 4) != 0) {
            uVar23 = *puVar8;
            goto LAB_00123661;
          }
          if ((uVar2 & 8) != 0) {
            uVar35 = (undefined4)*puVar8;
            goto LAB_001235de;
          }
          pcVar30 = "NULL";
          if ((uVar2 & 1) == 0) {
            pcVar30 = "(blob)";
          }
        }
        else {
          pcVar30 = (char *)puVar8[2];
        }
        break;
      case 0xf7:
        lVar26 = *(long *)(pbVar28 + 0x10);
        sqlite3_str_appendf(local_158,"k(%d",(ulong)*(ushort *)(lVar26 + 6));
        if (*(short *)(lVar26 + 6) != 0) {
          uVar34 = 0;
          do {
            puVar8 = *(undefined8 **)(lVar26 + 0x20 + uVar34 * 8);
            pcVar19 = "";
            if (puVar8 != (undefined8 *)0x0) {
              pcVar19 = (char *)*puVar8;
            }
            iVar15 = strcmp(pcVar19,"BINARY");
            if (iVar15 == 0) {
              pcVar19 = "B";
            }
            pcVar24 = "-";
            if (*(char *)(*(long *)(lVar26 + 0x18) + uVar34) == '\0') {
              pcVar24 = "";
            }
            sqlite3_str_appendf(local_158,",%s%s",pcVar24,pcVar19);
            uVar34 = uVar34 + 1;
          } while (uVar34 < *(ushort *)(lVar26 + 6));
        }
        uVar34 = (ulong)local_158[0].nChar;
        if (local_158[0].nChar + 1 < local_158[0].nAlloc) {
          local_158[0].nChar = local_158[0].nChar + 1;
          local_158[0].zText[uVar34] = ')';
        }
        else {
          enlargeAndAppend(local_158,")",1);
        }
        break;
      case 0xf8:
        sqlite3_str_appendf(local_158,"%s(%d)",*(undefined8 *)(*(char **)(pbVar28 + 0x10) + 0x38),
                            (ulong)(uint)(int)**(char **)(pbVar28 + 0x10));
        break;
      case 0xfa:
        uVar23 = **(undefined8 **)(pbVar28 + 0x10);
        pcVar19 = "%s";
        goto LAB_0012385b;
      case 0xfc:
        sqlite3_str_appendf(local_158,"program");
        break;
      case 0xfd:
        sqlite3_str_appendf(local_158,"%d",(ulong)*(uint *)(pbVar28 + 0x10));
        break;
      case 0xfe:
        uVar23 = **(undefined8 **)(pbVar28 + 0x10);
        pcVar19 = "(%.20s)";
LAB_0012385b:
        sqlite3_str_appendf(local_158,pcVar19,uVar23);
      }
      sqlite3StrAccumFinish(local_158);
      pcVar19 = local_1c8[3].z;
      if (pcVar30 == pcVar19) {
        if (pcVar19 == (char *)0x0) {
          uVar33 = 0;
        }
        else {
          sVar20 = strlen(pcVar19);
          uVar33 = (uint)sVar20 & 0x3fffffff;
        }
        local_1c8[3].n = uVar33;
        local_1c8[3].enc = '\x01';
      }
      else {
        local_1c8[3].n = 0;
        sqlite3VdbeMemSetStr(local_1c8 + 3,pcVar30,-1,'\x01',(_func_void_void_ptr *)0x0);
      }
      if ((*(ushort *)(pStmt + 0xc5) & 0xc) == 4) {
        iVar15 = sqlite3VdbeMemClearAndResize(local_1c8 + 4,4);
        uVar16 = 1;
        if (iVar15 == 0) {
          local_1c8[4].flags = 0x202;
          local_1c8[4].n = 2;
          sqlite3_snprintf(3,local_1c8[4].z,"%.2x",(ulong)*(ushort *)(pbVar28 + 2));
          local_1c8[4].enc = '\x01';
          local_1c8[5].flags = 1;
          goto LAB_001239bf;
        }
      }
      else {
LAB_001239bf:
        *(ushort *)(pStmt + 0xc0) = ~*(ushort *)(pStmt + 0xc5) & 0xc;
        *(long *)(pStmt + 0xa0) = *(long *)(pStmt + 0x68) + 0x38;
        *(undefined4 *)(pStmt + 0x38) = 0;
        uVar16 = 100;
      }
LAB_0012309a:
      uVar33 = 100;
      if (uVar16 != 100) {
        if (0 < *(long *)(pStmt + 0xb8)) {
          invokeProfileCallback(psVar3,(Vdbe *)pStmt);
        }
        uVar33 = uVar16;
        if (uVar16 == 0x65) {
          if (psVar3->autoCommit == '\0') {
            uVar33 = 0x65;
          }
          else {
            if (psVar3->nDb < 1) {
              iVar15 = 0;
            }
            else {
              lVar31 = 0;
              lVar26 = 0;
              iVar15 = 0;
              do {
                p_00 = *(Btree **)((long)&psVar3->aDb->pBt + lVar31);
                if (p_00 != (Btree *)0x0) {
                  if ((p_00->sharable != '\0') &&
                     (p_00->wantToLock = p_00->wantToLock + 1, p_00->locked == '\0')) {
                    btreeLockCarefully(p_00);
                  }
                  pWVar5 = p_00->pBt->pPager->pWal;
                  if (pWVar5 == (Wal *)0x0) {
                    uVar29 = 0;
                  }
                  else {
                    uVar29 = pWVar5->iCallback;
                    pWVar5->iCallback = 0;
                  }
                  if (p_00->sharable != '\0') {
                    piVar1 = &p_00->wantToLock;
                    *piVar1 = *piVar1 + -1;
                    if (*piVar1 == 0) {
                      unlockBtreeMutex(p_00);
                    }
                  }
                  if (((0 < (int)uVar29) &&
                      (psVar3->xWalCallback != (_func_int_void_ptr_sqlite3_ptr_char_ptr_int *)0x0))
                     && (iVar15 == 0)) {
                    iVar15 = (*psVar3->xWalCallback)
                                       (psVar3->pWalArg,psVar3,
                                        *(char **)((long)&psVar3->aDb->zDbSName + lVar31),uVar29);
                  }
                }
                lVar26 = lVar26 + 1;
                lVar31 = lVar31 + 0x20;
              } while (lVar26 < psVar3->nDb);
            }
            *(int *)(pStmt + 0x38) = iVar15;
            uVar33 = 1;
            if (iVar15 == 0) {
              uVar33 = 0x65;
            }
          }
        }
      }
      psVar3->errCode = uVar33;
      psVar4 = *(sqlite3 **)pStmt;
      if ((*(uint *)(pStmt + 0x38) == 0xc0a) || (psVar4->mallocFailed != '\0')) {
        apiOomError(psVar4);
LAB_0012321a:
        *(undefined4 *)(pStmt + 0x38) = 7;
      }
      else if ((*(uint *)(pStmt + 0x38) & psVar4->errMask) == 7) goto LAB_0012321a;
LAB_00123221:
      if ((uVar33 - 0x66 < 0xfffffffe) && ((char)pStmt[0xc4] < '\0')) {
        uVar33 = sqlite3VdbeTransferError((Vdbe *)pStmt);
      }
      uVar33 = uVar33 & psVar3->errMask;
LAB_00123242:
      if (uVar33 != 0x11) break;
      if (iVar13 == 0x32) {
        uVar33 = 0x11;
        break;
      }
      if (pStmt == (sqlite3_stmt *)0x0) {
        pcVar19 = (char *)0x0;
      }
      else {
        pcVar19 = *(char **)(pStmt + 0xf0);
      }
      iVar15 = *(int *)(pStmt + 0x34);
      psVar3 = *(sqlite3 **)pStmt;
      uVar16 = sqlite3LockAndPrepare
                         (psVar3,pcVar19,-1,(uint)(byte)pStmt[0xc4],(Vdbe *)pStmt,
                          (sqlite3_stmt **)&local_160,(char **)0x0);
      p_01 = local_160;
      if (uVar16 == 0) {
        memcpy(local_158,local_160,0x128);
        memcpy(p_01,pStmt,0x128);
        memcpy(pStmt,local_158,0x128);
        pVVar6 = p_01->pNext;
        p_01->pNext = *(Vdbe **)(pStmt + 0x10);
        *(Vdbe **)(pStmt + 0x10) = pVVar6;
        pVVar6 = p_01->pPrev;
        p_01->pPrev = *(Vdbe **)(pStmt + 8);
        *(Vdbe **)(pStmt + 8) = pVVar6;
        pcVar19 = p_01->zSql;
        p_01->zSql = *(char **)(pStmt + 0xf0);
        *(char **)(pStmt + 0xf0) = pcVar19;
        *(u32 *)(pStmt + 0x114) = p_01->expmask;
        pStmt[0xc4] = (sqlite3_stmt)p_01->prepFlags;
        uVar23 = *(undefined8 *)p_01->aCounter;
        uVar10 = *(undefined8 *)(p_01->aCounter + 2);
        uVar11 = *(undefined8 *)(p_01->aCounter + 5);
        *(undefined8 *)(pStmt + 0xdc) = *(undefined8 *)(p_01->aCounter + 3);
        *(undefined8 *)(pStmt + 0xe4) = uVar11;
        *(undefined8 *)(pStmt + 0xd0) = uVar23;
        *(undefined8 *)(pStmt + 0xd8) = uVar10;
        *(int *)(pStmt + 0xe4) = *(int *)(pStmt + 0xe4) + 1;
        sqlite3TransferBindings((sqlite3_stmt *)p_01,pStmt);
        p_01->rc = 0;
        sqlite3VdbeFinalize(p_01);
        uVar16 = 0;
      }
      else if (uVar16 == 7) {
        sqlite3OomFault(psVar3);
      }
      if (uVar16 == 0) {
        sqlite3_reset(pStmt);
        uVar33 = 0;
        if (-1 < iVar15) {
          pStmt[0xc5] = (sqlite3_stmt)((byte)pStmt[0xc5] | 0x10);
        }
      }
      else {
        pcVar19 = (char *)sqlite3ValueText(db->pErr,'\x01');
        if (*(void **)(pStmt + 0xa8) != (void *)0x0) {
          sqlite3DbFreeNN(db,*(void **)(pStmt + 0xa8));
        }
        if (db->mallocFailed == '\0') {
          pcVar19 = sqlite3DbStrDup(db,pcVar19);
          *(char **)(pStmt + 0xa8) = pcVar19;
          if ((uVar16 == 0xc0a) || (db->mallocFailed != '\0')) {
            apiOomError(db);
            uVar33 = 7;
          }
          else {
            uVar33 = db->errMask & uVar16;
          }
          *(uint *)(pStmt + 0x38) = uVar33;
        }
        else {
          *(undefined8 *)(pStmt + 0xa8) = 0;
          *(undefined4 *)(pStmt + 0x38) = 7;
          uVar33 = 7;
        }
      }
      iVar13 = iVar13 + 1;
    } while (uVar16 == 0);
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
  }
  else {
    uVar33 = 0x15;
    sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x14046,
                "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
  }
  return uVar33;
}

Assistant:

SQLITE_API int sqlite3_step(sqlite3_stmt *pStmt){
  int rc = SQLITE_OK;      /* Result from sqlite3Step() */
  Vdbe *v = (Vdbe*)pStmt;  /* the prepared statement */
  int cnt = 0;             /* Counter to prevent infinite loop of reprepares */
  sqlite3 *db;             /* The database connection */

  if( vdbeSafetyNotNull(v) ){
    return SQLITE_MISUSE_BKPT;
  }
  db = v->db;
  sqlite3_mutex_enter(db->mutex);
  v->doingRerun = 0;
  while( (rc = sqlite3Step(v))==SQLITE_SCHEMA
         && cnt++ < SQLITE_MAX_SCHEMA_RETRY ){
    int savedPc = v->pc;
    rc = sqlite3Reprepare(v);
    if( rc!=SQLITE_OK ){
      /* This case occurs after failing to recompile an sql statement. 
      ** The error message from the SQL compiler has already been loaded 
      ** into the database handle. This block copies the error message 
      ** from the database handle into the statement and sets the statement
      ** program counter to 0 to ensure that when the statement is 
      ** finalized or reset the parser error message is available via
      ** sqlite3_errmsg() and sqlite3_errcode().
      */
      const char *zErr = (const char *)sqlite3_value_text(db->pErr); 
      sqlite3DbFree(db, v->zErrMsg);
      if( !db->mallocFailed ){
        v->zErrMsg = sqlite3DbStrDup(db, zErr);
        v->rc = rc = sqlite3ApiExit(db, rc);
      } else {
        v->zErrMsg = 0;
        v->rc = rc = SQLITE_NOMEM_BKPT;
      }
      break;
    }
    sqlite3_reset(pStmt);
    if( savedPc>=0 ) v->doingRerun = 1;
    assert( v->expired==0 );
  }
  sqlite3_mutex_leave(db->mutex);
  return rc;
}